

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

TSentences * __thiscall
NJamSpell::TTokenizer::Process
          (TSentences *__return_storage_ptr__,TTokenizer *this,wstring *originalText)

{
  wchar_t wVar1;
  ctype *pcVar2;
  const_iterator cVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  TWord local_68;
  uint local_4c;
  undefined1 auStack_48 [4];
  wchar_t letter;
  TWords currSentence;
  
  if (originalText->_M_string_length == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar4 = 0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _auStack_48 = (pointer)0x0;
    currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.Ptr = (wchar_t *)0x0;
    local_68.Len = 0;
    uVar5 = 0;
    do {
      wVar1 = (originalText->_M_dataplus)._M_p[uVar5];
      pcVar2 = std::use_facet<std::ctype<wchar_t>>(&this->Locale);
      local_4c = (**(code **)(*(long *)pcVar2 + 0x40))(pcVar2,wVar1);
      cVar3 = std::
              _Hashtable<wchar_t,_wchar_t,_std::allocator<wchar_t>,_std::__detail::_Identity,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->Alphabet)._M_h,(key_type *)&local_4c);
      if (cVar3.super__Node_iterator_base<wchar_t,_false>._M_cur == (__node_type *)0x0) {
        if (local_68.Ptr != (wchar_t *)0x0) {
          if (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
            _M_realloc_insert<NJamSpell::TWord_const&>
                      ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)auStack_48,
                       (iterator)
                       currSentence.
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                       _M_impl.super__Vector_impl_data._M_start,&local_68);
          }
          else {
            (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
             _M_impl.super__Vector_impl_data._M_start)->Ptr = local_68.Ptr;
            (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
             _M_impl.super__Vector_impl_data._M_start)->Len = local_68.Len;
            currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 currSentence.
                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
          local_68.Ptr = (wchar_t *)0x0;
          local_68.Len = 0;
        }
      }
      else {
        if (local_68.Ptr == (wchar_t *)0x0) {
          local_68.Ptr = (wchar_t *)((long)(originalText->_M_dataplus)._M_p + lVar4);
        }
        local_68.Len = local_68.Len + 1;
      }
      if (((((ulong)local_4c < 0x40) && ((0x8000400200000000U >> ((ulong)local_4c & 0x3f) & 1) != 0)
           ) && (_auStack_48 !=
                 currSentence.
                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                 super__Vector_impl_data._M_start)) &&
         (std::
          vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)auStack_48),
         currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
         _M_impl.super__Vector_impl_data._M_start != _auStack_48)) {
        currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_start = _auStack_48;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (uVar5 < originalText->_M_string_length);
    if (local_68.Ptr != (wchar_t *)0x0) {
      if (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
        _M_realloc_insert<NJamSpell::TWord_const&>
                  ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)auStack_48,
                   (iterator)
                   currSentence.
                   super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_68);
      }
      else {
        (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
         _M_impl.super__Vector_impl_data._M_start)->Ptr = local_68.Ptr;
        (currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
         _M_impl.super__Vector_impl_data._M_start)->Len = local_68.Len;
        currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_start =
             currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    if (_auStack_48 !=
        currSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::
      vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)auStack_48);
    }
    if (_auStack_48 != (pointer)0x0) {
      operator_delete(_auStack_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TSentences TTokenizer::Process(const std::wstring& originalText) const {
    if (originalText.empty()) {
        return TSentences();
    }

    TSentences sentences;

    TWords currSentence;
    TWord currWord;

    for (size_t i = 0; i < originalText.size(); ++i) {
        wchar_t letter = std::tolower(originalText[i], Locale);
        if (Alphabet.find(letter) != Alphabet.end()) {
            if (currWord.Ptr == nullptr) {
                currWord.Ptr = &originalText[i];
            }
            currWord.Len += 1;
        } else {
            if (currWord.Ptr != nullptr) {
                currSentence.push_back(currWord);
                currWord = TWord();
            }
        }
        if (letter == L'?' || letter == L'!' || letter == L'.') {
            if (!currSentence.empty()) {
                sentences.push_back(currSentence);
                currSentence.clear();
            }
        }
    }
    if (currWord.Ptr != nullptr) {
        currSentence.push_back(currWord);
    }
    if (!currSentence.empty()) {
        sentences.push_back(currSentence);
    }

    return sentences;
}